

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O2

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::step_two(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
           *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  double dVar1;
  size_type *psVar2;
  size_type sVar3;
  pointer pVVar4;
  pointer pAVar5;
  size_type *psVar6;
  reference rVar7;
  
  psVar2 = (this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = &this->row_cover;
  for (psVar6 = (this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; psVar6 != psVar2; psVar6 = psVar6 + 1) {
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,*psVar6);
    if ((*rVar7._M_p & rVar7._M_mask) == 0) {
      sVar3 = *psVar6;
      pVVar4 = (this->graph_->vertices_).
               super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pAVar5 = *(pointer *)&((Adjacencies *)((long)(pVVar4 + sVar3) + 0x20))->vector_;
          pAVar5 != *(pointer *)((long)(pVVar4 + sVar3) + 0x28); pAVar5 = pAVar5 + 1) {
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (&this->col_cover,
                           pAVar5->vertex_ -
                           ((long)(this->rows_).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->rows_).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3));
        if ((*rVar7._M_p & rVar7._M_mask) == 0) {
          rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,*psVar6);
          if ((((*rVar7._M_p & rVar7._M_mask) == 0) &&
              (dVar1 = (this->costs_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[pAVar5->edge_], dVar1 == 0.0)) &&
             (!NAN(dVar1))) {
            rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              (&this->col_cover,
                               pAVar5->vertex_ -
                               ((long)(this->rows_).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->rows_).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
            *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
            rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,*psVar6);
            *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
            (this->mask_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[pAVar5->edge_] = 1;
          }
        }
        sVar3 = *psVar6;
        pVVar4 = (this->graph_->vertices_).
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  clear_covers(this);
  this->step_ = THREE;
  return;
}

Assistant:

void
Matching<GRAPH, COST, MASK>::step_two()
{
    for (auto const& row : rows_) {
        if (row_cover[row])
            continue;

        for (auto it = graph_.adjacenciesFromVertexBegin(row);
             it != graph_.adjacenciesFromVertexEnd(row); ++it) {

            // star zero entries.
            if (!col_cover[col_of_idx(it->vertex())] && !row_cover[row] &&
                costs_[it->edge()] == 0) {
                col_cover[col_of_idx(it->vertex())] = true;
                row_cover[row] = true;
                mask_[it->edge()] = STARRED;
            }
        }
    }

    // reset covers.
    clear_covers();

    step_ = Step::THREE;
}